

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanTest<char,unsigned_int>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_27;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_26;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_25;
  int local_24;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  int local_1c [3];
  
  local_1c[2] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_25,local_1c + 2);
  if (local_25.m_int < '\x02') {
    local_1c[1] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_26,local_1c + 1);
    if ('\x05' < local_26.m_int) {
      local_1c[0] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_27,local_1c);
      local_24 = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_20,&local_24);
      return (long)(ulong)local_20.m_int < (long)local_27.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanTest()
	{
		return
			(U)2 > SafeInt<T>(3) &&
			SafeInt<T>(4) > (U)5 &&
			SafeInt<T>(6) > SafeInt<U>(7);
	}